

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

int mattacku(monst *mtmp)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  obj *poVar8;
  char *pcVar9;
  bool bVar10;
  int local_41c;
  char *local_418;
  bool local_3bc;
  byte local_3bb;
  byte local_3ba;
  bool local_3b9;
  int local_3b8;
  int hittmp;
  int foo;
  char *from_nowhere;
  char genericwere [256];
  char buf_1 [256];
  int local_19c;
  int numhelp;
  int numseen;
  char buf [256];
  int save_spe;
  obj *obj_1;
  obj *obj;
  coord cc;
  boolean youseeit;
  boolean foundyou;
  boolean range2;
  permonst *ppStack_78;
  boolean ranged;
  permonst *mdat;
  musable musable;
  int sum [6];
  int tmp;
  int j;
  int i;
  attack alt_attk;
  attack *mattk;
  monst *mtmp_local;
  
  ppStack_78 = mtmp->data;
  iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  obj._7_1_ = 3 < iVar3;
  bVar1 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
  obj._6_1_ = (bVar1 != '\0' ^ 0xffU) & 1;
  local_3b9 = false;
  if (mtmp->mux == u.ux) {
    local_3b9 = mtmp->muy == u.uy;
  }
  obj._5_1_ = local_3b9;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((local_3ba = 0, ublindf == (obj *)0x0 || (local_3ba = 0, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (local_3ba = 0, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (local_3ba = 0, (mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_0021fd58;
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0021fc8d;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x0021fc8d:
    local_3ba = 0;
    if (bVar2 == 0) goto LAB_0021fd58;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (local_3bb = 0, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (local_3bb = 0, (*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0)) {
    local_3bc = (*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0 || ((byte)u._1052_1_ >> 5 & 1) != 0;
    local_3bb = local_3bc ^ 0xff;
  }
  local_3ba = local_3bb;
LAB_0021fd58:
  obj._4_1_ = local_3ba & 1;
  if (obj._7_1_ == '\0') {
    nomul(0,(char *)0x0);
  }
  if ((mtmp->mhp < 1) || ((((byte)u._1052_1_ >> 1 & 1) != 0 && ((mtmp->data->mflags1 & 2) == 0)))) {
    return 0;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (u.usteed != (monst *)0x0) {
      if (mtmp == u.usteed) {
        return 0;
      }
      iVar3 = 4;
      if ((mtmp->data->mflags2 & 0x80) != 0) {
        iVar3 = 2;
      }
      iVar3 = rn2(iVar3);
      if ((iVar3 == 0) &&
         (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 3)) {
        uVar4 = mattackm(mtmp,u.usteed);
        if ((uVar4 & 4) != 0) {
          return 1;
        }
        if (((uVar4 & 2) == 0) && (u.umoved == '\0')) {
          uVar4 = mattackm(u.usteed,mtmp);
          return (uint)((uVar4 & 2) != 0);
        }
        return 0;
      }
    }
  }
  else {
    if (mtmp != u.ustuck) {
      return 0;
    }
    (u.ustuck)->mux = u.ux;
    (u.ustuck)->muy = u.uy;
    obj._6_1_ = 0;
    obj._5_1_ = '\x01';
    if (((byte)u._1052_1_ >> 4 & 1) != 0) {
      return 0;
    }
  }
  if ((((((byte)u._1052_1_ >> 2 & 1) != 0) && (obj._6_1_ == 0)) && (obj._5_1_ != '\0')) &&
     ((u._1052_1_ & 1) == 0)) {
    u._1052_1_ = u._1052_1_ & 0xfb;
    if (((youmonst.data)->mflags1 & 0x100) == 0) {
      if (obj._4_1_ == 0) {
        pline("It tries to move where you are hiding.");
      }
      else {
        poVar8 = level->objects[u.ux][u.uy];
        if ((poVar8 == (obj *)0x0) &&
           (((youmonst.data)->mlet != '9' ||
            (bVar1 = is_pool(level,(int)u.ux,(int)u.uy), bVar1 == '\0')))) {
          warning("hiding under nothing?");
        }
        else {
          buf[0xfc] = '\0';
          buf[0xfd] = '\0';
          buf[0xfe] = '\0';
          buf[0xff] = '\0';
          if ((poVar8 != (obj *)0x0) && (buf._252_4_ = SEXT14(poVar8->spe), poVar8->otyp == 0x10f))
          {
            poVar8->spe = '\0';
          }
          if ((youmonst.data)->mlet == '9') {
            pcVar6 = m_monnam(mtmp);
            pcVar7 = mons_mname(youmonst.data);
            pline("Wait, %s!  There\'s a hidden %s named %s there!",pcVar6,pcVar7,plname);
          }
          else {
            pcVar6 = m_monnam(mtmp);
            pcVar7 = mons_mname(youmonst.data);
            pcVar9 = doname(level->objects[u.ux][u.uy]);
            pline("Wait, %s!  There\'s a %s named %s hiding under %s!",pcVar6,pcVar7,plname,pcVar9);
          }
          if (poVar8 != (obj *)0x0) {
            poVar8->spe = (schar)buf._252_4_;
          }
        }
      }
      newsym((int)u.ux,(int)u.uy);
    }
    else {
      pcVar6 = ceiling((int)u.ux,(int)u.uy);
      pline("You fall from the %s!",pcVar6);
      bVar1 = enexto((coord *)((long)&obj + 2),level,u.ux,u.uy,youmonst.data);
      if (bVar1 == '\0') {
        pcVar6 = Monnam(mtmp);
        pcVar7 = mons_mname(youmonst.data);
        pline("%s is killed by a falling %s (you)!",pcVar6,pcVar7);
        killed(mtmp);
        newsym((int)u.ux,(int)u.uy);
        if (mtmp->mhp < 1) {
          return 1;
        }
        return 0;
      }
      remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
      newsym((int)mtmp->mx,(int)mtmp->my);
      place_monster(mtmp,(int)u.ux,(int)u.uy);
      if (mtmp->wormno != '\0') {
        worm_move(mtmp);
      }
      teleds((int)obj._2_1_,(int)obj._3_1_,'\x01');
      set_apparxy(level,mtmp);
      newsym((int)u.ux,(int)u.uy);
      if ((youmonst.data)->mlet != '\x10') {
        return 0;
      }
      poVar8 = which_armor(mtmp,4);
      if (((poVar8 == (obj *)0x0) ||
          ((*(ushort *)&objects[poVar8->otyp].field_0x11 >> 4 & 0x1f) < 0xb)) ||
         (0x11 < (*(ushort *)&objects[poVar8->otyp].field_0x11 >> 4 & 0x1f))) {
        iVar3 = find_mac(mtmp);
        iVar5 = rnd(0x14);
        if (iVar5 < iVar3 + 3) {
          pcVar6 = Monnam(mtmp);
          pline("%s is almost hit by a falling piercer (you)!",pcVar6);
        }
        else {
          pcVar6 = Monnam(mtmp);
          pline("%s is hit by a falling piercer (you)!",pcVar6);
          iVar3 = dice(3,6);
          iVar3 = mtmp->mhp - iVar3;
          mtmp->mhp = iVar3;
          if (iVar3 < 1) {
            killed(mtmp);
          }
        }
      }
      else {
        pcVar6 = mon_nam(mtmp);
        pcVar6 = s_suffix(pcVar6);
        pline("Your blow glances off %s helmet.",pcVar6);
      }
    }
    return 0;
  }
  if (((((youmonst.data)->mlet == '\r') && (youmonst.m_ap_type != '\0')) && (obj._6_1_ == 0)) &&
     ((obj._5_1_ != '\0' && ((u._1052_1_ & 1) == 0)))) {
    if (obj._4_1_ == 0) {
      pline("It gets stuck on you.");
    }
    else {
      pcVar6 = m_monnam(mtmp);
      pcVar7 = mons_mname(youmonst.data);
      pline("Wait, %s!  That\'s a %s named %s!",pcVar6,pcVar7,plname);
    }
    youmonst.m_ap_type = '\0';
    youmonst.mappearance = 0;
    u.ustuck = mtmp;
    newsym((int)u.ux,(int)u.uy);
    return 0;
  }
  if (((youmonst.m_ap_type == '\x02') && (obj._6_1_ == 0)) &&
     ((obj._5_1_ != '\0' && ((u._1052_1_ & 1) == 0)))) {
    if (obj._4_1_ == 0) {
      pcVar6 = "disturbs you";
      if ((mtmp->data->mflags2 & 0x10000000) != 0 && youmonst.mappearance == 0x1ef) {
        pcVar6 = "tries to pick you up";
      }
      pline("Something %s!",pcVar6);
    }
    else {
      pcVar6 = m_monnam(mtmp);
      pcVar7 = mimic_obj_name(&youmonst);
      pcVar9 = mons_mname(mons + u.umonnum);
      pcVar9 = an(pcVar9);
      pline("Wait, %s!  That %s is really %s named %s!",pcVar6,pcVar7,pcVar9,plname);
    }
    if (multi < 0) {
      if (u.umonnum == u.umonster) {
        local_418 = "yourself";
      }
      else {
        pcVar6 = mons_mname(youmonst.data);
        local_418 = an(pcVar6);
      }
      sprintf((char *)&numhelp,"You appear to be %s again.",local_418);
      unmul((char *)&numhelp);
    }
    return 0;
  }
  if (u.uac < '\0') {
    local_41c = rnd(-(int)u.uac);
    local_41c = -local_41c;
  }
  else {
    local_41c = (int)u.uac;
  }
  sum[4] = (uint)mtmp->m_lev + local_41c + 10;
  if (multi < 0) {
    sum[4] = sum[4] + 4;
  }
  if ((((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
        (youmonst.data == mons + 0x9e)) || (youmonst.data == mons + 0x7b)) &&
      ((u.uprops[0xd].blocked == 0 && ((ppStack_78->mflags1 & 0x1000000) == 0)))) ||
     ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0)) {
    sum[4] = sum[4] + -2;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) != 0) {
    sum[4] = sum[4] + -2;
  }
  if (sum[4] < 1) {
    sum[4] = 1;
  }
  if (((ppStack_78->mlet == '9') && ((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0)) &&
     ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffffffd;
    newsym((int)mtmp->mx,(int)mtmp->my);
  }
  if (((((((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0) && ((ppStack_78->mflags2 & 0x200) != 0)) &&
        (obj._6_1_ == 0)) && ((mtmp->data != mons + 0x13a && (mtmp->data != mons + 0x12f)))) &&
      (mtmp->data != mons + 0x130)) &&
     (((uwep == (obj *)0x0 || (uwep->oartifact != '\x0e')) &&
      (((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0 && (iVar3 = rn2(0xd), iVar3 == 0)))))) {
    msummon(mtmp,&mtmp->dlevel->z);
  }
  if ((((*(uint *)&mtmp->field_0x60 >> 4 & 7) == 0) && ((ppStack_78->mflags2 & 4) != 0)) &&
     (obj._6_1_ == 0)) {
    if ((ppStack_78->mflags2 & 8) == 0) {
      iVar3 = rn2(0x1e);
      if ((iVar3 == 0) && ((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) {
        new_were(mtmp);
      }
    }
    else {
      iVar3 = night();
      iVar3 = rn2(iVar3 * -2 + 5);
      if ((iVar3 == 0) && ((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) {
        new_were(mtmp);
      }
    }
    ppStack_78 = mtmp->data;
    iVar3 = rn2(10);
    if ((iVar3 == 0) && ((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) {
      strcpy((char *)&from_nowhere,"creature");
      iVar3 = were_summon(ppStack_78,'\0',&local_19c,(char *)&from_nowhere);
      if (obj._4_1_ == 0) {
        if (flags.soundok == '\0') {
          _hittmp = " from nowhere";
        }
        else {
          pcVar6 = growl_sound(mtmp);
          makeplural(pcVar6);
          pline("Something %s!");
          _hittmp = "";
        }
        if (0 < iVar3) {
          if (local_19c < 1) {
            pline("You feel hemmed in.");
          }
          else {
            if (local_19c == 1) {
              pcVar6 = an((char *)&from_nowhere);
              sprintf(genericwere + 0xf8,"%s appears",pcVar6);
            }
            else {
              pcVar6 = makeplural((char *)&from_nowhere);
              sprintf(genericwere + 0xf8,"%s appear",pcVar6);
            }
            pcVar6 = upstart(genericwere + 0xf8);
            pline("%s%s!",pcVar6,_hittmp);
          }
        }
      }
      else {
        Monnam(mtmp);
        pline("%s summons help!");
        if (iVar3 < 1) {
          pline("But none comes.");
        }
        else if (local_19c == 0) {
          pline("You feel hemmed in.");
        }
      }
    }
  }
  if (((byte)u._1052_1_ >> 4 & 1) != 0) {
    if (mtmp == u.ustuck) {
      pcVar6 = Monnam(mtmp);
      pline("%s loosens its grip slightly.",pcVar6);
    }
    else if (obj._6_1_ == 0) {
      if ((obj._4_1_ == 0) &&
         (((((mtmp->data->mflags1 & 0x10000) != 0 ||
            ((poVar8 = which_armor(mtmp,4), poVar8 != (obj *)0x0 &&
             (poVar8 = which_armor(mtmp,4), poVar8->otyp == 0x4f)))) ||
           ((((u.uprops[0x1e].intrinsic == 0 &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
               ((((u.uprops[0x19].intrinsic == 0 &&
                  ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                 (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
              (u.uprops[0x19].blocked != 0)))) &&
            (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
             (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
          (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
           (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')))))) {
        pline("You feel something move nearby.");
      }
      else {
        pcVar6 = Monnam(mtmp);
        pline("%s starts to attack you, but pulls back.",pcVar6);
      }
    }
    return 0;
  }
  memset(&mdat,0,0x28);
  bVar1 = find_offensive(mtmp,(musable *)&mdat);
  if ((bVar1 != '\0') && (iVar3 = use_offensive(mtmp,(musable *)&mdat), iVar3 != 0)) {
    return (uint)(iVar3 == 1);
  }
  tmp = 0;
  do {
    if (5 < tmp) {
      return 0;
    }
    sum[(long)tmp + -2] = 0;
    _i = getmattk(ppStack_78,tmp,(int *)&musable.has_misc,(attack *)&j);
    if (((u._1052_1_ & 1) == 0) || (_i->aatyp == '\v')) {
      uVar4 = (uint)_i->aatyp;
      if (uVar4 - 1 < 6) {
LAB_0022109a:
        if ((obj._6_1_ == 0) &&
           ((((mtmp->mw == (obj *)0x0 || ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0)) ||
             ((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)))) ||
            ((youmonst.data != mons + 0xc && (youmonst.data != mons + 0xb)))))) {
          if (obj._5_1_ == '\0') {
            wildmiss(mtmp,_i);
          }
          else {
            iVar3 = rnd(tmp + 0x14);
            if (iVar3 < sum[4]) {
              if ((_i->aatyp != '\x03') || (((youmonst.data)->mflags1 & 0x200000) == 0)) {
                iVar3 = hitmu(mtmp,_i);
                sum[(long)tmp + -2] = iVar3;
              }
            }
            else {
              missmu(mtmp,sum[4] == iVar3,_i);
            }
          }
        }
      }
      else if (uVar4 == 7) {
        if (((((obj._6_1_ == 0) && (1 < tmp)) && (sum[(long)(tmp + -1) + -2] != 0)) &&
            (sum[(long)(tmp + -2) + -2] != 0)) || (mtmp == u.ustuck)) {
          iVar3 = hitmu(mtmp,_i);
          sum[(long)tmp + -2] = iVar3;
        }
      }
      else if (uVar4 == 10) {
        if (obj._6_1_ != 0) {
          iVar3 = spitmu(mtmp,_i);
          sum[(long)tmp + -2] = iVar3;
        }
      }
      else if (uVar4 == 0xb) {
        if (obj._6_1_ == 0) {
          if (obj._5_1_ == '\0') {
            if ((mtmp->data->mflags1 & 0x40000) == 0) {
              if (obj._4_1_ == 0) {
                bVar10 = true;
                if (mtmp->data->mlet != '\x16') {
                  bVar10 = mtmp->data == mons + 0x9f;
                }
                pcVar6 = "splat";
                if (bVar10) {
                  pcVar6 = "rushing noise";
                }
                You_hear("a %s nearby.",pcVar6);
              }
              else {
                pcVar6 = Monnam(mtmp);
                pline("%s lunges forward and recoils!",pcVar6);
              }
            }
            else {
              pcVar6 = Monnam(mtmp);
              pline("%s gulps some air!",pcVar6);
            }
          }
          else if (((u._1052_1_ & 1) == 0) && (iVar3 = rnd(tmp + 0x14), sum[4] <= iVar3)) {
            missmu(mtmp,sum[4] == iVar3,_i);
          }
          else {
            flush_screen();
            iVar3 = gulpmu(mtmp,_i);
            sum[(long)tmp + -2] = iVar3;
          }
        }
      }
      else if (uVar4 == 0xc) {
        if (obj._6_1_ != 0) {
          iVar3 = breamu(mtmp,_i);
          sum[(long)tmp + -2] = iVar3;
        }
      }
      else if (uVar4 == 0xd) {
        if (obj._6_1_ == 0) {
          iVar3 = explmu(mtmp,_i,obj._5_1_);
          sum[(long)tmp + -2] = iVar3;
        }
      }
      else if (uVar4 == 0xf) {
        if (ppStack_78 != mons + 0x127) {
          iVar3 = gazemu(mtmp,_i);
          sum[(long)tmp + -2] = iVar3;
        }
      }
      else {
        if (uVar4 == 0x10) goto LAB_0022109a;
        if (uVar4 == 0xfe) {
          if (obj._6_1_ == 0) {
            local_3b8 = 0;
            if ((mtmp->weapon_check == '\x01') || (mtmp->mw == (obj *)0x0)) {
              mtmp->weapon_check = '\x03';
              iVar3 = mon_wield_item(mtmp);
              if (iVar3 != 0) goto LAB_00221599;
            }
            if (obj._5_1_ == '\0') {
              wildmiss(mtmp,_i);
            }
            else {
              otmp = mtmp->mw;
              if (otmp != (obj *)0x0) {
                local_3b8 = hitval(otmp,&youmonst);
                sum[4] = local_3b8 + sum[4];
                mswings(mtmp,otmp);
              }
              dieroll = rnd(tmp + 0x14);
              if (dieroll < sum[4]) {
                iVar3 = hitmu(mtmp,_i);
                sum[(long)tmp + -2] = iVar3;
              }
              else {
                missmu(mtmp,sum[4] == dieroll,_i);
              }
              if (otmp != (obj *)0x0) {
                sum[4] = sum[4] - local_3b8;
              }
            }
          }
          else {
            bVar1 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
            if (bVar1 == '\0') {
              thrwmu(mtmp);
            }
          }
        }
        else if (uVar4 == 0xff) {
          if (obj._6_1_ == 0) {
            iVar3 = castmu(mtmp,_i,'\x01',obj._5_1_);
            sum[(long)tmp + -2] = iVar3;
          }
          else {
            iVar3 = buzzmu(mtmp,_i);
            sum[(long)tmp + -2] = iVar3;
          }
        }
      }
LAB_00221599:
      if (iflags.botl != '\0') {
        bot();
      }
      if (((sum[(long)tmp + -2] == 1) && (u.usleep != 0)) && ((uint)u.usleep < moves)) {
        if ((((u.uprops[3].intrinsic == 0) && (u.uprops[3].extrinsic == 0)) &&
            (((youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))) ||
           ((((u.uprops[3].intrinsic & 0x4000000) != 0 &&
             ((u.uprops[3].intrinsic & 0xfbffffff) == 0)) &&
            ((u.uprops[3].extrinsic == 0 &&
             (((youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))))))) {
          bVar10 = false;
          if (((u.uprops[3].intrinsic & 0x4000000) != 0) &&
             (((bVar10 = false, (u.uprops[3].intrinsic & 0xfbffffff) == 0 &&
               (bVar10 = false, u.uprops[3].extrinsic == 0)) &&
              (bVar10 = false, (youmonst.mintrinsics & 4) == 0)))) {
            bVar10 = u.uprops[0x38].extrinsic == 0;
          }
          iVar3 = 10;
          if (bVar10) {
            iVar3 = 5;
          }
          iVar3 = rn2(iVar3);
          if (iVar3 != 0) goto LAB_00221756;
        }
        multi = -1;
        nomovemsg = "The combat suddenly awakens you.";
      }
LAB_00221756:
      if (sum[(long)tmp + -2] == 2) {
        return 1;
      }
      if (sum[(long)tmp + -2] == 3) {
        return 0;
      }
    }
    tmp = tmp + 1;
  } while( true );
}

Assistant:

int mattacku(struct monst *mtmp)
{
	const struct attack *mattk;
	struct attack alt_attk;
	int	i, j, tmp, sum[NATTK];
	struct musable musable;
	
	const struct permonst *mdat = mtmp->data;
	boolean ranged = (distu(mtmp->mx, mtmp->my) > 3);
		/* Is it near you?  Affects your actions */
	boolean range2 = !monnear(mtmp, mtmp->mux, mtmp->muy);
		/* Does it think it's near you?  Affects its actions */
	boolean foundyou = (mtmp->mux==u.ux && mtmp->muy==u.uy);
		/* Is it attacking you or your image? */
	boolean youseeit = canseemon(level, mtmp);
		/* Might be attacking your image around the corner, or
		 * invisible, or you might be blind....
		 */
	
	if (!ranged) nomul(0, NULL);
	if (mtmp->mhp <= 0 || (Underwater && !is_swimmer(mtmp->data)))
	    return 0;

	/* If swallowed, can only be affected by u.ustuck */
	if (u.uswallow) {
	    if (mtmp != u.ustuck)
		return 0;
	    u.ustuck->mux = u.ux;
	    u.ustuck->muy = u.uy;
	    range2 = 0;
	    foundyou = 1;
	    if (u.uinvulnerable) return 0; /* stomachs can't hurt you! */
	}

	else if (u.usteed) {
		if (mtmp == u.usteed)
			/* Your steed won't attack you */
			return 0;
		/* Orcs like to steal and eat horses and the like */
		if (!rn2(is_orc(mtmp->data) ? 2 : 4) &&
				distu(mtmp->mx, mtmp->my) <= 2) {
			/* Attack your steed instead */
			i = mattackm(mtmp, u.usteed);
			if ((i & MM_AGR_DIED))
				return 1;
			if (i & MM_DEF_DIED || u.umoved)
				return 0;
			/* Let your steed retaliate */
			return !!(mattackm(u.usteed, mtmp) & MM_DEF_DIED);
		}
	}

	if (u.uundetected && !range2 && foundyou && !u.uswallow) {
		u.uundetected = 0;
		if (is_hider(youmonst.data)) {
		    coord cc; /* maybe we need a unexto() function? */
		    struct obj *obj;

		    pline("You fall from the %s!", ceiling(u.ux,u.uy));
		    if (enexto(&cc, level, u.ux, u.uy, youmonst.data)) {
			remove_monster(level, mtmp->mx, mtmp->my);
			newsym(mtmp->mx,mtmp->my);
			place_monster(mtmp, u.ux, u.uy);
			if (mtmp->wormno) worm_move(mtmp);
			teleds(cc.x, cc.y, TRUE);
			set_apparxy(level, mtmp);
			newsym(u.ux,u.uy);
		    } else {
			pline("%s is killed by a falling %s (you)!",
					Monnam(mtmp), mons_mname(youmonst.data));
			killed(mtmp);
			newsym(u.ux,u.uy);
			if (mtmp->mhp > 0) return 0;
			else return 1;
		    }
		    if (youmonst.data->mlet != S_PIERCER)
			return 0;	/* trappers don't attack */

		    obj = which_armor(mtmp, WORN_HELMET);
		    if (obj && is_metallic(obj)) {
			pline("Your blow glances off %s helmet.",
			               s_suffix(mon_nam(mtmp)));
		    } else {
			if (3 + find_mac(mtmp) <= rnd(20)) {
			    pline("%s is hit by a falling piercer (you)!",
								Monnam(mtmp));
			    if ((mtmp->mhp -= dice(3,6)) < 1)
				killed(mtmp);
			} else
			  pline("%s is almost hit by a falling piercer (you)!",
								Monnam(mtmp));
		    }
		} else {
		    if (!youseeit)
			pline("It tries to move where you are hiding.");
		    else {
			/* Ugly kludge for eggs.  The message is phrased so as
			 * to be directed at the monster, not the player,
			 * which makes "laid by you" wrong.  For the
			 * parallelism to work, we can't rephrase it, so we
			 * zap the "laid by you" momentarily instead.
			 */
			struct obj *obj = level->objects[u.ux][u.uy];

			if (obj ||
			      (youmonst.data->mlet == S_EEL && is_pool(level, u.ux, u.uy))) {
			    int save_spe = 0; /* suppress warning */
			    if (obj) {
				save_spe = obj->spe;
				if (obj->otyp == EGG) obj->spe = 0;
			    }
			    if (youmonst.data->mlet == S_EEL)
		pline("Wait, %s!  There's a hidden %s named %s there!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname);
			    else
	     pline("Wait, %s!  There's a %s named %s hiding under %s!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname,
				doname(level->objects[u.ux][u.uy]));
			    if (obj) obj->spe = save_spe;
			} else
			    warning("hiding under nothing?");
		    }
		    newsym(u.ux,u.uy);
		}
		return 0;
	}
	if (youmonst.data->mlet == S_MIMIC && youmonst.m_ap_type &&
		    !range2 && foundyou && !u.uswallow) {
		if (!youseeit) pline("It gets stuck on you.");
		else pline("Wait, %s!  That's a %s named %s!",
			   m_monnam(mtmp), mons_mname(youmonst.data), plname);
		u.ustuck = mtmp;
		youmonst.m_ap_type = M_AP_NOTHING;
		youmonst.mappearance = 0;
		newsym(u.ux,u.uy);
		return 0;
	}

	/* player might be mimicking an object */
	if (youmonst.m_ap_type == M_AP_OBJECT && !range2 && foundyou && !u.uswallow) {
	    if (!youseeit)
		 pline("Something %s!",
			(likes_gold(mtmp->data) && youmonst.mappearance == GOLD_PIECE) ?
			"tries to pick you up" : "disturbs you");
	    else pline("Wait, %s!  That %s is really %s named %s!",
			m_monnam(mtmp),
			mimic_obj_name(&youmonst),
			an(mons_mname(&mons[u.umonnum])),
			plname);
	    if (multi < 0) {	/* this should always be the case */
		char buf[BUFSZ];
		sprintf(buf, "You appear to be %s again.",
			Upolyd ? (const char *) an(mons_mname(youmonst.data)) :
			    (const char *) "yourself");
		unmul(buf);	/* immediately stop mimicking */
	    }
	    return 0;
	}

/*	Work out the armor class differential	*/
	tmp = AC_VALUE(u.uac) + 10;		/* tmp ~= 0 - 20 */
	tmp += mtmp->m_lev;
	if (multi < 0) tmp += 4;
	if ((Invis && !perceives(mdat)) || !mtmp->mcansee)
		tmp -= 2;
	if (mtmp->mtrapped) tmp -= 2;
	if (tmp <= 0) tmp = 1;

	/* make eels visible the moment they hit/miss us */
	if (mdat->mlet == S_EEL && mtmp->minvis && cansee(mtmp->mx,mtmp->my)) {
		mtmp->minvis = 0;
		newsym(mtmp->mx,mtmp->my);
	}

/*	Special demon handling code */
	if (!mtmp->cham && is_demon(mdat) && !range2
	   && mtmp->data != &mons[PM_BALROG]
	   && mtmp->data != &mons[PM_SUCCUBUS]
	   && mtmp->data != &mons[PM_INCUBUS]
	   && (!uwep || uwep->oartifact != ART_DEMONBANE))
	    if (!mtmp->mcan && !rn2(13))	msummon(mtmp, &mtmp->dlevel->z);

/*	Special lycanthrope handling code */
	if (!mtmp->cham && is_were(mdat) && !range2) {

	    if (is_human(mdat)) {
		if (!rn2(5 - (night() * 2)) && !mtmp->mcan) new_were(mtmp);
	    } else if (!rn2(30) && !mtmp->mcan) new_were(mtmp);
	    mdat = mtmp->data;

	    if (!rn2(10) && !mtmp->mcan) {
	    	int numseen, numhelp;
		char buf[BUFSZ], genericwere[BUFSZ];

		strcpy(genericwere, "creature");
		numhelp = were_summon(mdat, FALSE, &numseen, genericwere);
		if (youseeit) {
			pline("%s summons help!", Monnam(mtmp));
			if (numhelp > 0) {
			    if (numseen == 0)
				pline("You feel hemmed in.");
			} else pline("But none comes.");
		} else {
			const char *from_nowhere;

			if (flags.soundok) {
				pline("Something %s!",
					makeplural(growl_sound(mtmp)));
				from_nowhere = "";
			} else from_nowhere = " from nowhere";
			if (numhelp > 0) {
			    if (numseen < 1) pline("You feel hemmed in.");
			    else {
				if (numseen == 1)
			    		sprintf(buf, "%s appears",
							an(genericwere));
			    	else
			    		sprintf(buf, "%s appear",
							makeplural(genericwere));
				pline("%s%s!", upstart(buf), from_nowhere);
			    }
			} /* else no help came; but you didn't know it tried */
		}
	    }
	}

	if (u.uinvulnerable) {
	    /* monsters won't attack you */
	    if (mtmp == u.ustuck)
		pline("%s loosens its grip slightly.", Monnam(mtmp));
	    else if (!range2) {
		if (youseeit || sensemon(mtmp))
		    pline("%s starts to attack you, but pulls back.",
			  Monnam(mtmp));
		else
		    pline("You feel something move nearby.");
	    }
	    return 0;
	}

	/* Unlike defensive stuff, don't let them use item _and_ attack. */
	memset(&musable, 0, sizeof(musable));
	if (find_offensive(mtmp, &musable)) {
		int foo = use_offensive(mtmp, &musable);

		if (foo != 0) return foo==1;
	}

	for (i = 0; i < NATTK; i++) {

	    sum[i] = 0;
	    mattk = getmattk(mdat, i, sum, &alt_attk);
	    if (u.uswallow && (mattk->aatyp != AT_ENGL))
		continue;
	    switch(mattk->aatyp) {
		case AT_CLAW:	/* "hand to hand" attacks */
		case AT_KICK:
		case AT_BITE:
		case AT_STNG:
		case AT_TUCH:
		case AT_BUTT:
		case AT_TENT:
			if (!range2 && (!MON_WEP(mtmp) || mtmp->mconf || Conflict ||
					!touch_petrifies(youmonst.data))) {
			    if (foundyou) {
				if (tmp > (j = rnd(20+i))) {
				    if (mattk->aatyp != AT_KICK ||
					    !thick_skinned(youmonst.data))
					sum[i] = hitmu(mtmp, mattk);
				} else
				    missmu(mtmp, (tmp == j), mattk);
			    } else
				wildmiss(mtmp, mattk);
			}
			break;

		case AT_HUGS:	/* automatic if prev two attacks succeed */
			/* Note: if displaced, prev attacks never succeeded */
			if ((!range2 && i>=2 && sum[i-1] && sum[i-2])
							|| mtmp == u.ustuck)
				sum[i]= hitmu(mtmp, mattk);
			break;

		case AT_GAZE:	/* can affect you either ranged or not */
			/* Medusa gaze already operated through m_respond in
			 * dochug(); don't gaze more than once per round.
			 */
			if (mdat != &mons[PM_MEDUSA])
				sum[i] = gazemu(mtmp, mattk);
			break;

		case AT_EXPL:	/* automatic hit if next to, and aimed at you */
			if (!range2) sum[i] = explmu(mtmp, mattk, foundyou);
			break;

		case AT_ENGL:
			if (!range2) {
			    if (foundyou) {
				if (u.uswallow || tmp > (j = rnd(20+i))) {
				    /* Force swallowing monster to be
				     * displayed even when player is
				     * moving away */
				    flush_screen();
				    sum[i] = gulpmu(mtmp, mattk);
				} else {
				    missmu(mtmp, (tmp == j), mattk);
				}
			    } else if (is_animal(mtmp->data)) {
				pline("%s gulps some air!", Monnam(mtmp));
			    } else {
				if (youseeit)
				    pline("%s lunges forward and recoils!",
					  Monnam(mtmp));
				else
				    You_hear("a %s nearby.",
					     is_whirly(mtmp->data) ?
						"rushing noise" : "splat");
			   }
			}
			break;
		case AT_BREA:
			if (range2) sum[i] = breamu(mtmp, mattk);
			/* Note: breamu takes care of displacement */
			break;
		case AT_SPIT:
			if (range2) sum[i] = spitmu(mtmp, mattk);
			/* Note: spitmu takes care of displacement */
			break;
		case AT_WEAP:
			if (range2) {
				if (!Is_rogue_level(&u.uz))
					thrwmu(mtmp);
			} else {
			    int hittmp = 0;

			    /* Rare but not impossible.  Normally the monster
			     * wields when 2 spaces away, but it can be
			     * teleported or whatever....
			     */
			    if (mtmp->weapon_check == NEED_WEAPON ||
							!MON_WEP(mtmp)) {
				mtmp->weapon_check = NEED_HTH_WEAPON;
				/* mon_wield_item resets weapon_check as
				 * appropriate */
				if (mon_wield_item(mtmp) != 0) break;
			    }
			    if (foundyou) {
				otmp = MON_WEP(mtmp);
				if (otmp) {
				    hittmp = hitval(otmp, &youmonst);
				    tmp += hittmp;
				    mswings(mtmp, otmp);
				}
				if (tmp > (j = dieroll = rnd(20+i)))
				    sum[i] = hitmu(mtmp, mattk);
				else
				    missmu(mtmp, (tmp == j), mattk);
				/* KMH -- Don't accumulate to-hit bonuses */
				if (otmp)
					tmp -= hittmp;
			    } else
				wildmiss(mtmp, mattk);
			}
			break;
		case AT_MAGC:
			if (range2)
			    sum[i] = buzzmu(mtmp, mattk);
			else
			    sum[i] = castmu(mtmp, mattk, TRUE, foundyou);
			break;

		default:		/* no attack */
			break;
	    }
	    if (iflags.botl) bot();
	/* give player a chance of waking up before dying -kaa */
	    if (sum[i] == 1) {	    /* successful attack */
		if (u.usleep && u.usleep < moves &&
		    (FSleep_resistance || !rn2(PSleep_resistance ? 5 : 10))) {
		    multi = -1;
		    nomovemsg = "The combat suddenly awakens you.";
		}
	    }
	    if (sum[i] == 2) return 1;		/* attacker dead */
	    if (sum[i] == 3) break;  /* attacker teleported, no more attacks */
	    /* sum[i] == 0: unsuccessful attack */
	}
	return 0;
}